

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_ReadTag_Test::
VarintCasesWithSizes_ReadTag_Test(VarintCasesWithSizes_ReadTag_Test *this)

{
  VarintCasesWithSizes_ReadTag_Test *this_local;
  
  VarintCasesWithSizes::VarintCasesWithSizes(&this->super_VarintCasesWithSizes);
  (this->super_VarintCasesWithSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__VarintCasesWithSizes_ReadTag_Test_02a13c80;
  (this->super_VarintCasesWithSizes).
  super_WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_02a13cc0;
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, ReadTag) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint32_t expected_value = static_cast<uint32_t>(kVarintCases_case.value);
    EXPECT_EQ(expected_value, coded_input.ReadTag());

    EXPECT_TRUE(coded_input.LastTagWas(expected_value));
    EXPECT_FALSE(coded_input.LastTagWas(expected_value + 1));
  }

  EXPECT_EQ(kVarintCases_case.size, input.ByteCount());
}